

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O3

void __thiscall
fizplex::BaseTestRegularNoReordering_ForwardTransformDVector_Test::
~BaseTestRegularNoReordering_ForwardTransformDVector_Test
          (BaseTestRegularNoReordering_ForwardTransformDVector_Test *this)

{
  BaseTestRegularNoReordering::~BaseTestRegularNoReordering
            (&this->super_BaseTestRegularNoReordering);
  operator_delete(this,0x108);
  return;
}

Assistant:

TEST_F(BaseTestRegularNoReordering, ForwardTransformDVector) {
  b.ftran(dv0);
  b.ftran(dv1);
  b.ftran(dv2);
  EXPECT_EQ(DVector({-2, 3, 9}), dv0);
  EXPECT_EQ(DVector({8, -11, -34}), dv1);
  EXPECT_EQ(DVector({-5, 7, 21}), dv2);
}